

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udatamem.cpp
# Opt level: O1

int32_t udata_getLength_63(UDataMemory *pData)

{
  int iVar1;
  uint16_t uVar2;
  int32_t iVar3;
  
  iVar3 = -1;
  if (((pData != (UDataMemory *)0x0) && (pData->pHeader != (DataHeader *)0x0)) &&
     (iVar1 = pData->length, -1 < iVar1)) {
    uVar2 = udata_getHeaderSize_63(pData->pHeader);
    iVar3 = iVar1 - (uint)uVar2;
  }
  return iVar3;
}

Assistant:

U_CAPI int32_t U_EXPORT2
udata_getLength(const UDataMemory *pData) {
    if(pData!=NULL && pData->pHeader!=NULL && pData->length>=0) {
        /*
         * subtract the header size,
         * return only the size of the actual data starting at udata_getMemory()
         */
        return pData->length-udata_getHeaderSize(pData->pHeader);
    } else {
        return -1;
    }
}